

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O0

void __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
Parse<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
          (GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
          *ds)

{
  SizeType SVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  SizeType s_00;
  uint *puVar5;
  State *pSVar6;
  Operator *pOVar7;
  size_t sVar8;
  Frag *pFVar9;
  Frag *e;
  undefined4 uStack_d8;
  SizeType local_d4;
  SizeType local_d0;
  SizeType local_cc;
  SizeType s;
  SizeType range;
  uint m;
  uint n;
  undefined1 local_b8 [4];
  uint codepoint;
  Stack<rapidjson::CrtAllocator> atomCountStack;
  undefined1 local_78 [8];
  Stack<rapidjson::CrtAllocator> operatorStack;
  Stack<rapidjson::CrtAllocator> operandStack;
  DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
  *ds_local;
  GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  Stack<rapidjson::CrtAllocator>::Stack
            ((Stack<rapidjson::CrtAllocator> *)&operatorStack.initialCapacity_,
             *(CrtAllocator **)(this + 8),0x100);
  Stack<rapidjson::CrtAllocator>::Stack
            ((Stack<rapidjson::CrtAllocator> *)local_78,*(CrtAllocator **)(this + 8),0x100);
  Stack<rapidjson::CrtAllocator>::Stack
            ((Stack<rapidjson::CrtAllocator> *)local_b8,*(CrtAllocator **)(this + 8),0x100);
  puVar5 = Stack<rapidjson::CrtAllocator>::Push<unsigned_int>
                     ((Stack<rapidjson::CrtAllocator> *)local_b8,1);
  *puVar5 = 0;
LAB_00170569:
  while (uVar4 = DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
                 ::Peek(ds), uVar4 != 0) {
    n = DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
        ::Take(ds);
    switch(n) {
    case 0x24:
      this[0x7d] = (GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>)0x1;
      break;
    case 0x28:
      pOVar7 = Stack<rapidjson::CrtAllocator>::
               Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Operator>
                         ((Stack<rapidjson::CrtAllocator> *)local_78,1);
      *pOVar7 = kLeftParenthesis;
      puVar5 = Stack<rapidjson::CrtAllocator>::Push<unsigned_int>
                         ((Stack<rapidjson::CrtAllocator> *)local_b8,1);
      *puVar5 = 0;
      break;
    case 0x29:
      while( true ) {
        bVar2 = Stack<rapidjson::CrtAllocator>::Empty((Stack<rapidjson::CrtAllocator> *)local_78);
        bVar3 = false;
        if (!bVar2) {
          pOVar7 = Stack<rapidjson::CrtAllocator>::
                   Top<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Operator>
                             ((Stack<rapidjson::CrtAllocator> *)local_78);
          bVar3 = *pOVar7 != kLeftParenthesis;
        }
        if (!bVar3) break;
        pOVar7 = Stack<rapidjson::CrtAllocator>::
                 Pop<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Operator>
                           ((Stack<rapidjson::CrtAllocator> *)local_78,1);
        bVar3 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Eval
                          ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                           (Stack<rapidjson::CrtAllocator> *)&operatorStack.initialCapacity_,*pOVar7
                          );
        if (!bVar3) {
          m = 1;
          goto LAB_00170d1b;
        }
      }
      bVar3 = Stack<rapidjson::CrtAllocator>::Empty((Stack<rapidjson::CrtAllocator> *)local_78);
      if (bVar3) {
        m = 1;
        goto LAB_00170d1b;
      }
      Stack<rapidjson::CrtAllocator>::
      Pop<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Operator>
                ((Stack<rapidjson::CrtAllocator> *)local_78,1);
      Stack<rapidjson::CrtAllocator>::Pop<unsigned_int>
                ((Stack<rapidjson::CrtAllocator> *)local_b8,1);
      GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::ImplicitConcatenation
                ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                 (Stack<rapidjson::CrtAllocator> *)local_b8,
                 (Stack<rapidjson::CrtAllocator> *)local_78);
      break;
    case 0x2a:
      bVar3 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Eval
                        ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                         (Stack<rapidjson::CrtAllocator> *)&operatorStack.initialCapacity_,
                         kZeroOrMore);
      if (!bVar3) {
        m = 1;
        goto LAB_00170d1b;
      }
      break;
    case 0x2b:
      bVar3 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Eval
                        ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                         (Stack<rapidjson::CrtAllocator> *)&operatorStack.initialCapacity_,
                         kOneOrMore);
      if (!bVar3) {
        m = 1;
        goto LAB_00170d1b;
      }
      break;
    case 0x2e:
      GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushOperand
                ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                 (Stack<rapidjson::CrtAllocator> *)&operatorStack.initialCapacity_,0xffffffff);
      GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::ImplicitConcatenation
                ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                 (Stack<rapidjson::CrtAllocator> *)local_b8,
                 (Stack<rapidjson::CrtAllocator> *)local_78);
      break;
    case 0x3f:
      goto switchD_001705d0_caseD_3f;
    case 0x5b:
      bVar3 = ParseRange<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(this,ds,&local_cc);
      if (!bVar3) {
        m = 1;
        goto LAB_00170d1b;
      }
      local_d0 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::NewState
                           ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                            0xffffffff,0xffffffff,0xfffffffe);
      SVar1 = local_cc;
      pSVar6 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetState
                         ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                          local_d0);
      pSVar6->rangeStart = SVar1;
      GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Frag::Frag
                ((Frag *)((long)&e + 4),local_d0,local_d0,local_d0);
      pFVar9 = Stack<rapidjson::CrtAllocator>::
               Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                         ((Stack<rapidjson::CrtAllocator> *)&operatorStack.initialCapacity_,1);
      pFVar9->minIndex = local_d4;
      pFVar9->start = e._4_4_;
      pFVar9->out = uStack_d8;
      GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::ImplicitConcatenation
                ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                 (Stack<rapidjson::CrtAllocator> *)local_b8,
                 (Stack<rapidjson::CrtAllocator> *)local_78);
      break;
    case 0x5c:
      bVar3 = CharacterEscape<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(this,ds,&n);
      if (!bVar3) {
        m = 1;
        goto LAB_00170d1b;
      }
    default:
      GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushOperand
                ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                 (Stack<rapidjson::CrtAllocator> *)&operatorStack.initialCapacity_,n);
      GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::ImplicitConcatenation
                ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                 (Stack<rapidjson::CrtAllocator> *)local_b8,
                 (Stack<rapidjson::CrtAllocator> *)local_78);
      break;
    case 0x5e:
      this[0x7c] = (GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>)0x1;
      break;
    case 0x7b:
      bVar3 = ParseUnsigned<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(this,ds,&range);
      if (!bVar3) {
        m = 1;
        goto LAB_00170d1b;
      }
      uVar4 = DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
              ::Peek(ds);
      if (uVar4 == 0x2c) {
        DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
        ::Take(ds);
        uVar4 = DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
                ::Peek(ds);
        if (uVar4 == 0x7d) {
          s = 0xffffffff;
        }
        else {
          bVar3 = ParseUnsigned<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(this,ds,&s);
          if ((!bVar3) || (s < range)) {
            m = 1;
            goto LAB_00170d1b;
          }
        }
      }
      else {
        s = range;
      }
      bVar3 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::EvalQuantifier
                        ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                         (Stack<rapidjson::CrtAllocator> *)&operatorStack.initialCapacity_,range,s);
      if ((!bVar3) ||
         (uVar4 = DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
                  ::Peek(ds), uVar4 != 0x7d)) {
        m = 1;
        goto LAB_00170d1b;
      }
      DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
      ::Take(ds);
      break;
    case 0x7c:
      while( true ) {
        bVar2 = Stack<rapidjson::CrtAllocator>::Empty((Stack<rapidjson::CrtAllocator> *)local_78);
        bVar3 = false;
        if (!bVar2) {
          pOVar7 = Stack<rapidjson::CrtAllocator>::
                   Top<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Operator>
                             ((Stack<rapidjson::CrtAllocator> *)local_78);
          bVar3 = (int)*pOVar7 < 4;
        }
        if (!bVar3) break;
        pOVar7 = Stack<rapidjson::CrtAllocator>::
                 Pop<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Operator>
                           ((Stack<rapidjson::CrtAllocator> *)local_78,1);
        bVar3 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Eval
                          ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                           (Stack<rapidjson::CrtAllocator> *)&operatorStack.initialCapacity_,*pOVar7
                          );
        if (!bVar3) {
          m = 1;
          goto LAB_00170d1b;
        }
      }
      pOVar7 = Stack<rapidjson::CrtAllocator>::
               Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Operator>
                         ((Stack<rapidjson::CrtAllocator> *)local_78,1);
      *pOVar7 = kAlternation;
      puVar5 = Stack<rapidjson::CrtAllocator>::Top<unsigned_int>
                         ((Stack<rapidjson::CrtAllocator> *)local_b8);
      *puVar5 = 0;
    }
  }
  goto LAB_00170c1d;
switchD_001705d0_caseD_3f:
  bVar3 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Eval
                    ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                     (Stack<rapidjson::CrtAllocator> *)&operatorStack.initialCapacity_,kZeroOrOne);
  if (!bVar3) goto LAB_00170897;
  goto LAB_00170569;
LAB_00170897:
  m = 1;
  goto LAB_00170d1b;
  while( true ) {
    pOVar7 = Stack<rapidjson::CrtAllocator>::
             Pop<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Operator>
                       ((Stack<rapidjson::CrtAllocator> *)local_78,1);
    bVar3 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Eval
                      ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                       (Stack<rapidjson::CrtAllocator> *)&operatorStack.initialCapacity_,*pOVar7);
    if (!bVar3) break;
LAB_00170c1d:
    bVar3 = Stack<rapidjson::CrtAllocator>::Empty((Stack<rapidjson::CrtAllocator> *)local_78);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      sVar8 = Stack<rapidjson::CrtAllocator>::GetSize
                        ((Stack<rapidjson::CrtAllocator> *)&operatorStack.initialCapacity_);
      if (sVar8 == 0xc) {
        pFVar9 = Stack<rapidjson::CrtAllocator>::
                 Pop<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                           ((Stack<rapidjson::CrtAllocator> *)&operatorStack.initialCapacity_,1);
        SVar1 = pFVar9->out;
        s_00 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::NewState
                         ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                          0xffffffff,0xffffffff,0);
        GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Patch
                  ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,SVar1,s_00);
        *(SizeType *)(this + 0x70) = pFVar9->start;
      }
      m = 0;
      goto LAB_00170d1b;
    }
  }
  m = 1;
LAB_00170d1b:
  Stack<rapidjson::CrtAllocator>::~Stack((Stack<rapidjson::CrtAllocator> *)local_b8);
  Stack<rapidjson::CrtAllocator>::~Stack((Stack<rapidjson::CrtAllocator> *)local_78);
  Stack<rapidjson::CrtAllocator>::~Stack
            ((Stack<rapidjson::CrtAllocator> *)&operatorStack.initialCapacity_);
  return;
}

Assistant:

void Parse(DecodedStream<InputStream, Encoding>& ds) {
        Stack<Allocator> operandStack(allocator_, 256);    // Frag
        Stack<Allocator> operatorStack(allocator_, 256);   // Operator
        Stack<Allocator> atomCountStack(allocator_, 256);  // unsigned (Atom per parenthesis)

        *atomCountStack.template Push<unsigned>() = 0;

        unsigned codepoint;
        while (ds.Peek() != 0) {
            switch (codepoint = ds.Take()) {
                case '^':
                    anchorBegin_ = true;
                    break;

                case '$':
                    anchorEnd_ = true;
                    break;

                case '|':
                    while (!operatorStack.Empty() && *operatorStack.template Top<Operator>() < kAlternation)
                        if (!Eval(operandStack, *operatorStack.template Pop<Operator>(1)))
                            return;
                    *operatorStack.template Push<Operator>() = kAlternation;
                    *atomCountStack.template Top<unsigned>() = 0;
                    break;

                case '(':
                    *operatorStack.template Push<Operator>() = kLeftParenthesis;
                    *atomCountStack.template Push<unsigned>() = 0;
                    break;

                case ')':
                    while (!operatorStack.Empty() && *operatorStack.template Top<Operator>() != kLeftParenthesis)
                        if (!Eval(operandStack, *operatorStack.template Pop<Operator>(1)))
                            return;
                    if (operatorStack.Empty())
                        return;
                    operatorStack.template Pop<Operator>(1);
                    atomCountStack.template Pop<unsigned>(1);
                    ImplicitConcatenation(atomCountStack, operatorStack);
                    break;

                case '?':
                    if (!Eval(operandStack, kZeroOrOne))
                        return;
                    break;

                case '*':
                    if (!Eval(operandStack, kZeroOrMore))
                        return;
                    break;

                case '+':
                    if (!Eval(operandStack, kOneOrMore))
                        return;
                    break;

                case '{':
                    {
                        unsigned n, m;
                        if (!ParseUnsigned(ds, &n))
                            return;

                        if (ds.Peek() == ',') {
                            ds.Take();
                            if (ds.Peek() == '}')
                                m = kInfinityQuantifier;
                            else if (!ParseUnsigned(ds, &m) || m < n)
                                return;
                        }
                        else
                            m = n;

                        if (!EvalQuantifier(operandStack, n, m) || ds.Peek() != '}')
                            return;
                        ds.Take();
                    }
                    break;

                case '.':
                    PushOperand(operandStack, kAnyCharacterClass);
                    ImplicitConcatenation(atomCountStack, operatorStack);
                    break;

                case '[':
                    {
                        SizeType range;
                        if (!ParseRange(ds, &range))
                            return;
                        SizeType s = NewState(kRegexInvalidState, kRegexInvalidState, kRangeCharacterClass);
                        GetState(s).rangeStart = range;
                        *operandStack.template Push<Frag>() = Frag(s, s, s);
                    }
                    ImplicitConcatenation(atomCountStack, operatorStack);
                    break;

                case '\\': // Escape character
                    if (!CharacterEscape(ds, &codepoint))
                        return; // Unsupported escape character
                    // fall through to default
                    RAPIDJSON_DELIBERATE_FALLTHROUGH;

                default: // Pattern character
                    PushOperand(operandStack, codepoint);
                    ImplicitConcatenation(atomCountStack, operatorStack);
            }
        }

        while (!operatorStack.Empty())
            if (!Eval(operandStack, *operatorStack.template Pop<Operator>(1)))
                return;

        // Link the operand to matching state.
        if (operandStack.GetSize() == sizeof(Frag)) {
            Frag* e = operandStack.template Pop<Frag>(1);
            Patch(e->out, NewState(kRegexInvalidState, kRegexInvalidState, 0));
            root_ = e->start;

#if RAPIDJSON_REGEX_VERBOSE
            printf("root: %d\n", root_);
            for (SizeType i = 0; i < stateCount_ ; i++) {
                State& s = GetState(i);
                printf("[%2d] out: %2d out1: %2d c: '%c'\n", i, s.out, s.out1, (char)s.codepoint);
            }
            printf("\n");
#endif
        }
    }